

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  uchar *puVar1;
  string *psVar2;
  int iVar3;
  ulong uVar4;
  LogMessage aLStack_30 [16];
  undefined1 local_10 [16];
  
  if (this->backup_bytes_ != 0) {
    iVar3 = (int)local_10;
    uVar4 = (ulong)(uint)this->backup_bytes_;
    FreeBuffer();
    if ((*(int *)(uVar4 + 0x30) == 0) && (*(long *)(uVar4 + 0x20) != 0)) {
      if (*(int *)(uVar4 + 0x2c) < iVar3) {
        psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((long)iVar3,(long)*(int *)(uVar4 + 0x2c),"count <= buffer_used_");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)aLStack_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0xe7,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  (aLStack_30,
                   (char (*) [78])
                   " Can\'t back up over more bytes than were returned by the last call to Next().")
        ;
      }
      else {
        if (-1 < iVar3) {
          *(int *)(uVar4 + 0x30) = iVar3;
          return;
        }
        psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((long)iVar3,0,"count >= 0");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)aLStack_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0xea,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  (aLStack_30,(char (*) [42])" Parameter to BackUp() can\'t be negative.");
      }
    }
    else {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)aLStack_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0xe5,0x2b,"backup_bytes_ == 0 && buffer_.get() != NULL");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (aLStack_30,0x2a," BackUp() can only be called after Next().");
    }
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)aLStack_30);
  }
  this->buffer_used_ = 0;
  puVar1 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
    return;
  }
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  ABSL_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}